

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

char * show_asm_constraints(dmr_C *C,char *buf,char *sep,asm_constraint_list *list)

{
  int iVar1;
  undefined8 *puVar2;
  char *pcVar3;
  undefined1 local_48 [8];
  ptr_list_iter entryiter__;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)list);
  puVar2 = (undefined8 *)ptrlist_iter_next((ptr_list_iter *)local_48);
  while (puVar2 != (undefined8 *)0x0) {
    iVar1 = sprintf(buf,"%s\"%s\"",sep,puVar2[1]);
    buf = buf + iVar1;
    if ((pseudo_t)*puVar2 != (pseudo_t)0x0) {
      pcVar3 = dmrC_show_pseudo(C,(pseudo_t)*puVar2);
      iVar1 = sprintf(buf," (%s)",pcVar3);
      buf = buf + iVar1;
    }
    if ((ident *)puVar2[2] != (ident *)0x0) {
      pcVar3 = dmrC_show_ident(C,(ident *)puVar2[2]);
      iVar1 = sprintf(buf," [%s]",pcVar3);
      buf = buf + iVar1;
    }
    puVar2 = (undefined8 *)ptrlist_iter_next((ptr_list_iter *)local_48);
    sep = ", ";
  }
  return buf;
}

Assistant:

static char *show_asm_constraints(struct dmr_C *C, char *buf, const char *sep, struct asm_constraint_list *list)
{
	struct asm_constraint *entry;

	FOR_EACH_PTR(list, entry) {
		buf += sprintf(buf, "%s\"%s\"", sep, entry->constraint);
		if (entry->pseudo)
			buf += sprintf(buf, " (%s)", dmrC_show_pseudo(C, entry->pseudo));
		if (entry->ident)
			buf += sprintf(buf, " [%s]", dmrC_show_ident(C, entry->ident));
		sep = ", ";		
	} END_FOR_EACH_PTR(entry);
	return buf;
}